

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

void __thiscall
lf::io::VtkWriter::WriteScalarCellData<float>
          (VtkWriter *this,string *name,MeshDataSet<float> *mds,float undefined_value)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  reference ppEVar7;
  value_type *pvVar8;
  reference pvVar9;
  value_type local_128;
  Entity *local_c8;
  Entity *e;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 auStack_88 [8];
  ScalarData<float> data;
  float undefined_value_local;
  MeshDataSet<float> *mds_local;
  string *name_local;
  VtkWriter *this_local;
  
  CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
            (this,&(this->vtk_file_).cell_data,name);
  data.lookup_table._M_dataplus._M_p = (pointer)0x0;
  data.lookup_table._M_string_length = 0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.name.field_2._8_8_ = 0;
  data.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.name._M_string_length = 0;
  data.name.field_2._M_allocated_capacity = 0;
  auStack_88 = (undefined1  [8])0x0;
  data.name._M_dataplus._M_p = (pointer)0x0;
  data.lookup_table.field_2._M_allocated_capacity = 0;
  VtkFile::ScalarData<float>::ScalarData((ScalarData<float> *)auStack_88);
  peVar6 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  uVar4 = (*peVar6->_vptr_Mesh[3])(peVar6,(ulong)this->codim_);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),(ulong)uVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,name);
  peVar6 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar5 = (*peVar6->_vptr_Mesh[2])(peVar6,(ulong)this->codim_);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar5);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  e = (Entity *)
      std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&e);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppEVar7 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    local_c8 = *ppEVar7;
    bVar3 = (**(code **)(*(long *)mds + 8))(mds,local_c8);
    if ((bVar3 & 1) == 0) {
      peVar6 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar4 = (*peVar6->_vptr_Mesh[5])(peVar6,local_c8);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),
                          (ulong)uVar4);
      *pvVar9 = undefined_value;
    }
    else {
      pvVar8 = (value_type *)(*(code *)**(undefined8 **)mds)(mds,local_c8);
      vVar1 = *pvVar8;
      peVar6 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar4 = (*peVar6->_vptr_Mesh[5])(peVar6,local_c8);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)((long)&data.name.field_2 + 8),
                          (ulong)uVar4);
      *pvVar9 = vVar1;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  boost::
  variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>
  ::variant<lf::io::VtkFile::ScalarData<float>>
            ((variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>
              *)&local_128,(ScalarData<float> *)auStack_88,true);
  std::
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  ::push_back(&(this->vtk_file_).cell_data,&local_128);
  boost::
  variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
  ::~variant(&local_128);
  VtkFile::ScalarData<float>::~ScalarData((ScalarData<float> *)auStack_88);
  return;
}

Assistant:

void VtkWriter::WriteScalarCellData(const std::string& name,
                                    const mesh::utils::MeshDataSet<T>& mds,
                                    T undefined_value) {
  CheckAttributeSetName(vtk_file_.cell_data, name);
  VtkFile::ScalarData<T> data{};
  data.data.resize(mesh_->NumEntities(codim_));
  data.name = name;
  for (const auto* e : mesh_->Entities(codim_)) {
    if (mds.DefinedOn(*e)) {
      data.data[mesh_->Index(*e)] = mds(*e);
    } else {
      data.data[mesh_->Index(*e)] = undefined_value;
    }
  }
  vtk_file_.cell_data.push_back(std::move(data));
}